

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# folding_rules.cpp
# Opt level: O3

bool spvtools::opt::anon_unknown_0::CompositeExtractFeedingConstruct
               (IRContext *context,Instruction *inst,
               vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
               *param_3)

{
  OperandList *this;
  DefUseManager *this_00;
  pointer pOVar1;
  pointer pOVar2;
  array<signed_char,_4UL> aVar3;
  bool bVar4;
  uint32_t uVar5;
  _Type acVar6;
  Instruction *pIVar7;
  uint uVar8;
  Instruction *inst_2;
  uint32_t i;
  uint32_t uVar9;
  array<signed_char,_4UL> id;
  undefined8 local_a8;
  undefined1 auStack_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [8];
  undefined1 local_70 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  if (inst->opcode_ != OpCompositeConstruct) {
    __assert_fail("inst->opcode() == spv::Op::OpCompositeConstruct && \"Wrong opcode.  Should be OpCompositeConstruct.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/folding_rules.cpp"
                  ,0x6da,
                  "bool spvtools::opt::(anonymous namespace)::CompositeExtractFeedingConstruct(IRContext *, Instruction *, const std::vector<const analysis::Constant *> &)"
                 );
  }
  if ((context->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(context);
  }
  uVar8 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar8 = (uint)inst->has_result_id_;
  }
  id._M_elems[0] = '\0';
  id._M_elems[1] = '\0';
  id._M_elems[2] = '\0';
  id._M_elems[3] = '\0';
  if (uVar8 != (int)((ulong)((long)(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555) {
    this_00 = (context->def_use_mgr_)._M_t.
              super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              ._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
              .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
    this = &inst->operands_;
    inst_2 = (Instruction *)0x0;
    uVar9 = 0;
    do {
      uVar5 = Instruction::GetSingleWordOperand(inst,uVar8 + uVar9);
      pIVar7 = analysis::DefUseManager::GetDef(this_00,uVar5);
      if (inst_2 == (Instruction *)0x0) {
        inst_2 = pIVar7;
      }
      if (((pIVar7->opcode_ != OpCompositeExtract) ||
          (bVar4 = HaveSameIndexesExceptForLast(pIVar7,inst_2), !bVar4)) ||
         (uVar5 = Instruction::GetSingleWordOperand
                            (pIVar7,(int)((ulong)((long)(pIVar7->operands_).
                                                                                                                
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                 (long)(pIVar7->operands_).
                                                                                                              
                                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                                    -0x55555555 - 1), uVar9 != uVar5)) goto LAB_005a9b00;
      uVar5 = (pIVar7->has_result_id_ & 1) + 1;
      if (pIVar7->has_type_id_ == false) {
        uVar5 = (uint)pIVar7->has_result_id_;
      }
      acVar6 = (_Type)Instruction::GetSingleWordOperand(pIVar7,uVar5);
      aVar3._M_elems = acVar6;
      if ((uVar9 != 0) && (aVar3._M_elems = id._M_elems, id._M_elems != acVar6)) goto LAB_005a9b00;
      id._M_elems = aVar3._M_elems;
      uVar9 = uVar9 + 1;
      uVar8 = (inst->has_result_id_ & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar8 = (uint)inst->has_result_id_;
      }
    } while (uVar9 < (int)((ulong)((long)(inst->operands_).
                                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(inst->operands_).
                                        super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                     -0x55555555 - uVar8);
    pIVar7 = analysis::DefUseManager::GetDef(this_00,(uint32_t)id._M_elems);
    uVar5 = 0;
    uVar9 = 0;
    if (pIVar7->has_type_id_ == true) {
      uVar9 = Instruction::GetSingleWordOperand(pIVar7,0);
    }
    uVar9 = GetElementType(uVar9,(inst_2->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_start + 3,
                           (inst_2->operands_).
                           super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                           ._M_impl.super__Vector_impl_data._M_finish + -1,this_00);
    if (inst->has_type_id_ == true) {
      uVar5 = Instruction::GetSingleWordOperand(inst,0);
    }
    if (uVar5 == uVar9) {
      pOVar1 = (inst_2->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pOVar2 = (inst_2->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      uVar8 = (inst_2->has_result_id_ & 1) + 1;
      if (inst_2->has_type_id_ == false) {
        uVar8 = (uint)inst_2->has_result_id_;
      }
      if ((int)((ulong)((long)pOVar2 - (long)pOVar1) >> 4) * -0x55555555 - uVar8 == 2) {
        inst->opcode_ = OpCopyObject;
        local_70._24_8_ = local_70 + 0x10;
        local_70._0_8_ = &PTR__SmallVector_00930a20;
        local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_70._8_8_ = 1;
        local_a8 = CONCAT44(local_a8._4_4_,1);
        auStack_a0._0_8_ = &PTR__SmallVector_00930a20;
        auStack_a0._8_8_ = 0;
        auStack_a0._24_8_ = auStack_a0 + 0x10;
        local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_70._16_4_ = id._M_elems;
        utils::SmallVector<unsigned_int,_2UL>::operator=
                  ((SmallVector<unsigned_int,_2UL> *)auStack_a0,
                   (SmallVector<unsigned_int,_2UL> *)local_70);
        local_48 = 0;
        uStack_40 = 0;
        local_38 = 0;
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_initialize<spvtools::opt::Operand_const*>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_48,&local_a8,local_78);
        uVar8 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar8 = (uint)inst->has_result_id_;
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                  (this,(Operand *)
                        ((long)((((inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                               0xfffffffffffffffa) + (ulong)(uVar8 * 0x30)),
                   (inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)this,
                   (inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_48,uStack_40);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &local_48);
        auStack_a0._0_8_ = &PTR__SmallVector_00930a20;
        if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_80,local_80._M_head_impl);
        }
        local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
        local_70._0_8_ = &PTR__SmallVector_00930a20;
        if ((_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)
            local_50._M_head_impl !=
            (_Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>)0x0)
        {
          std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                    ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                     &local_50,local_50._M_head_impl);
        }
      }
      else {
        inst->opcode_ = OpCompositeExtract;
        local_a8 = 0;
        auStack_a0._0_8_ = (_func_int **)0x0;
        auStack_a0._8_8_ = 0;
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_initialize<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                   &local_a8,pOVar1 + 2,pOVar2 + -1);
        uVar8 = (inst->has_result_id_ & 1) + 1;
        if (inst->has_type_id_ == false) {
          uVar8 = (uint)inst->has_result_id_;
        }
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                  (this,(Operand *)
                        ((long)((((inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->words).buffer +
                               0xfffffffffffffffa) + (ulong)(uVar8 * 0x30)),
                   (inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                  ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)this,
                   (inst->operands_).
                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                   ._M_impl.super__Vector_impl_data._M_finish,local_a8,auStack_a0._0_8_);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &local_a8);
      }
      id._M_elems[0] = '\x01';
      id._M_elems[1] = '\0';
      id._M_elems[2] = '\0';
      id._M_elems[3] = '\0';
    }
    else {
LAB_005a9b00:
      id._M_elems[0] = '\0';
      id._M_elems[1] = '\0';
      id._M_elems[2] = '\0';
      id._M_elems[3] = '\0';
    }
  }
  return id._M_elems[0];
}

Assistant:

bool CompositeExtractFeedingConstruct(
    IRContext* context, Instruction* inst,
    const std::vector<const analysis::Constant*>&) {
  assert(inst->opcode() == spv::Op::OpCompositeConstruct &&
         "Wrong opcode.  Should be OpCompositeConstruct.");
  analysis::DefUseManager* def_use_mgr = context->get_def_use_mgr();
  uint32_t original_id = 0;

  if (inst->NumInOperands() == 0) {
    // The struct being constructed has no members.
    return false;
  }

  // Check each element to make sure they are:
  // - extractions
  // - extracting the same position they are inserting
  // - all extract from the same id.
  Instruction* first_element_inst = nullptr;
  for (uint32_t i = 0; i < inst->NumInOperands(); ++i) {
    const uint32_t element_id = inst->GetSingleWordInOperand(i);
    Instruction* element_inst = def_use_mgr->GetDef(element_id);
    if (first_element_inst == nullptr) {
      first_element_inst = element_inst;
    }

    if (element_inst->opcode() != spv::Op::OpCompositeExtract) {
      return false;
    }

    if (!HaveSameIndexesExceptForLast(element_inst, first_element_inst)) {
      return false;
    }

    if (element_inst->GetSingleWordInOperand(element_inst->NumInOperands() -
                                             1) != i) {
      return false;
    }

    if (i == 0) {
      original_id =
          element_inst->GetSingleWordInOperand(kExtractCompositeIdInIdx);
    } else if (original_id !=
               element_inst->GetSingleWordInOperand(kExtractCompositeIdInIdx)) {
      return false;
    }
  }
  assert(first_element_inst != nullptr);

  // The last check it to see that the object being extracted from is the
  // correct type.
  Instruction* original_inst = def_use_mgr->GetDef(original_id);
  uint32_t original_type_id =
      GetElementType(original_inst->type_id(), first_element_inst->begin() + 3,
                     first_element_inst->end() - 1, def_use_mgr);

  if (inst->type_id() != original_type_id) {
    return false;
  }

  if (first_element_inst->NumInOperands() == 2) {
    // Simplify by using the original object.
    inst->SetOpcode(spv::Op::OpCopyObject);
    inst->SetInOperands({{SPV_OPERAND_TYPE_ID, {original_id}}});
    return true;
  }

  // Copies the original id and all indexes except for the last to the new
  // extract instruction.
  inst->SetOpcode(spv::Op::OpCompositeExtract);
  inst->SetInOperands(std::vector<Operand>(first_element_inst->begin() + 2,
                                           first_element_inst->end() - 1));
  return true;
}